

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O1

Type wasm::TypeUpdating::getValidLocalType(Type type,FeatureSet features)

{
  bool bVar1;
  HeapType heapType;
  Type local_28;
  Type local_20;
  Type type_local;
  
  local_20.id = type.id;
  bVar1 = canHandleAsLocal(type);
  if (bVar1) {
    bVar1 = wasm::Type::isNonNullable(&local_20);
    if ((features.features >> 0xc & 1) == 0 && bVar1) {
      heapType = wasm::Type::getHeapType(&local_20);
      wasm::Type::Type(&local_28,heapType,Nullable);
      local_20.id = local_28.id;
    }
    return (Type)local_20.id;
  }
  __assert_fail("canHandleAsLocal(type)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                ,0x182,"Type wasm::TypeUpdating::getValidLocalType(Type, FeatureSet)");
}

Assistant:

Type getValidLocalType(Type type, FeatureSet features) {
  // TODO: this should handle tuples with a non-nullable item
  assert(canHandleAsLocal(type));
  if (type.isNonNullable() && !features.hasGCNNLocals()) {
    type = Type(type.getHeapType(), Nullable);
  }
  return type;
}